

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_AlreadyDefinedInOtherFile_Test::
~ValidationErrorTest_AlreadyDefinedInOtherFile_Test
          (ValidationErrorTest_AlreadyDefinedInOtherFile_Test *this)

{
  ValidationErrorTest_AlreadyDefinedInOtherFile_Test *this_local;
  
  ~ValidationErrorTest_AlreadyDefinedInOtherFile_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, AlreadyDefinedInOtherFile) {
  BuildFile(
      "name: \"foo.proto\" "
      "message_type { name: \"Foo\" }");

  BuildFileWithErrors(
      "name: \"bar.proto\" "
      "message_type { name: \"Foo\" }",

      "bar.proto: Foo: NAME: \"Foo\" is already defined in file "
      "\"foo.proto\".\n");
}